

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viface.cpp
# Opt level: O1

void __thiscall viface::VIfaceImpl::VIfaceImpl(VIfaceImpl *this,string *name,bool tap,int id)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  pointer puVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  string *psVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  size_t sVar10;
  long *plVar11;
  ssize_t sVar12;
  ulong uVar13;
  invalid_argument *this_00;
  int *piVar14;
  char *pcVar15;
  ostream *poVar16;
  runtime_error *prVar17;
  undefined8 uVar18;
  ulong *puVar19;
  long lVar20;
  ifreq ifr;
  viface_queues queues;
  sockaddr_ll socket_addr;
  ostringstream what;
  char buffer [4302];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2d0;
  ulong *local_2c8;
  long lStack_2c0;
  ulong local_2b8;
  long lStack_2b0;
  undefined8 local_2a8;
  viface_queues local_298;
  string *local_290;
  string *local_288;
  uint local_27c;
  char *local_278;
  long local_270;
  char local_268 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  char *local_230;
  long local_228;
  char local_220 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8 [3];
  ios_base local_178 [264];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  undefined1 *local_58 [2];
  undefined1 local_48 [24];
  
  local_1f0 = &this->pktbuff;
  (this->pktbuff).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pktbuff).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pktbuff).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_288 = (string *)&this->name;
  local_2d0 = &(this->name).field_2;
  (this->name)._M_dataplus._M_p = (pointer)local_2d0;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  local_2d8 = &(this->mac).field_2;
  (this->mac)._M_dataplus._M_p = (pointer)local_2d8;
  (this->mac)._M_string_length = 0;
  (this->mac).field_2._M_local_buf[0] = '\0';
  local_60 = &(this->ipv4).field_2;
  (this->ipv4)._M_dataplus._M_p = (pointer)local_60;
  (this->ipv4)._M_string_length = 0;
  (this->ipv4).field_2._M_local_buf[0] = '\0';
  local_68 = &(this->netmask).field_2;
  (this->netmask)._M_dataplus._M_p = (pointer)local_68;
  (this->netmask)._M_string_length = 0;
  (this->netmask).field_2._M_local_buf[0] = '\0';
  local_70 = &(this->broadcast).field_2;
  (this->broadcast)._M_dataplus._M_p = (pointer)local_70;
  (this->broadcast)._M_string_length = 0;
  (this->broadcast).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->ipv6s)._M_t._M_impl.super__Rb_tree_header;
  (this->ipv6s)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ipv6s)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ipv6s)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ipv6s)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ipv6s)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->stats_keys_cache)._M_t._M_impl.super__Rb_tree_header;
  (this->stats_keys_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->stats_keys_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->stats_keys_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->stats_keys_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->stats_keys_cache)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->stats_cache)._M_t._M_impl.super__Rb_tree_header;
  (this->stats_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->stats_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->stats_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->stats_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->stats_cache)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_27c = id;
  if (0xf < name->_M_string_length) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"--- Virtual interface name too long.");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_298.rx = 0;
  local_298.tx = 0;
  std::operator+(local_1e8,"/sys/class/net/",name);
  iVar7 = access(local_1e8[0]._M_dataplus._M_p,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8[0]._M_dataplus._M_p != &local_1e8[0].field_2) {
    operator_delete(local_1e8[0]._M_dataplus._M_p);
  }
  if (iVar7 != 0) {
    pcVar2 = (name->_M_dataplus)._M_p;
    local_230 = local_220;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_230,pcVar2,pcVar2 + name->_M_string_length);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
    lStack_2b0 = 0;
    local_2c8 = (ulong *)0x0;
    lStack_2c0 = 0;
    local_2a8 = 0;
    local_2b8 = (ulong)(ushort)(tap + 0x1101);
    strncpy((char *)&local_2c8,local_230,0xf);
    lVar20 = 0;
    do {
      iVar7 = open("/dev/net/tun",0x802);
      iVar9 = (int)lVar20;
      if (iVar7 < 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1e8,"--- Unable to open TUN/TAP device.",0x22);
        std::endl<char,std::char_traits<char>>((ostream *)local_1e8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"    Name: ",10);
        poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1e8,local_230,local_228);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16," Queue: ",8);
        poVar16 = (ostream *)std::ostream::operator<<(poVar16,iVar9);
        std::endl<char,std::char_traits<char>>(poVar16);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"    Error: ",0xb);
        piVar14 = __errno_location();
        pcVar15 = strerror(*piVar14);
        std::operator<<((ostream *)local_1e8,pcVar15);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8," (",2);
        poVar16 = (ostream *)std::ostream::operator<<((ostream *)local_1e8,*piVar14);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,").",2);
        std::endl<char,std::char_traits<char>>(poVar16);
LAB_00107937:
        if (iVar9 == 1) {
          iVar7 = close(local_298.rx);
          if (iVar7 < 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1e8,"--- Unable to close a TUN/TAP device.",0x25);
            std::endl<char,std::char_traits<char>>((ostream *)local_1e8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"    Name: ",10)
            ;
            poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1e8,local_230,local_228);
            std::__ostream_insert<char,std::char_traits<char>>(poVar16," Queue: ",8);
            poVar16 = (ostream *)std::ostream::operator<<(poVar16,0);
            std::endl<char,std::char_traits<char>>(poVar16);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1e8,"    Error: ",0xb);
            piVar14 = __errno_location();
            pcVar15 = strerror(*piVar14);
            std::operator<<((ostream *)local_1e8,pcVar15);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8," (",2);
            poVar16 = (ostream *)std::ostream::operator<<((ostream *)local_1e8,*piVar14);
            std::__ostream_insert<char,std::char_traits<char>>(poVar16,").",2);
            std::endl<char,std::char_traits<char>>(poVar16);
          }
        }
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar17,(string *)&local_258);
        __cxa_throw(prVar17,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar8 = ioctl(iVar7,0x400454ca,&local_2c8);
      if (iVar8 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1e8,"--- Unable to register a TUN/TAP device.",0x28);
        std::endl<char,std::char_traits<char>>((ostream *)local_1e8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"    Name: ",10);
        poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1e8,local_230,local_228);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16," Queue: ",8);
        poVar16 = (ostream *)std::ostream::operator<<(poVar16,iVar9);
        std::endl<char,std::char_traits<char>>(poVar16);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"    Error: ",0xb);
        piVar14 = __errno_location();
        pcVar15 = strerror(*piVar14);
        std::operator<<((ostream *)local_1e8,pcVar15);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8," (",2);
        poVar16 = (ostream *)std::ostream::operator<<((ostream *)local_1e8,*piVar14);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,").",2);
        std::endl<char,std::char_traits<char>>(poVar16);
        iVar7 = close(iVar7);
        if (iVar7 < 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1e8,"--- Unable to close a TUN/TAP device.",0x25);
          std::endl<char,std::char_traits<char>>((ostream *)local_1e8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"    Name: ",10);
          poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1e8,local_230,local_228);
          std::__ostream_insert<char,std::char_traits<char>>(poVar16," Queue: ",8);
          poVar16 = (ostream *)std::ostream::operator<<(poVar16,iVar9);
          std::endl<char,std::char_traits<char>>(poVar16);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"    Error: ",0xb)
          ;
          pcVar15 = strerror(*piVar14);
          std::operator<<((ostream *)local_1e8,pcVar15);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8," (",2);
          poVar16 = (ostream *)std::ostream::operator<<((ostream *)local_1e8,*piVar14);
          std::__ostream_insert<char,std::char_traits<char>>(poVar16,").",2);
          std::endl<char,std::char_traits<char>>(poVar16);
        }
        goto LAB_00107937;
      }
      (&local_298.rx)[lVar20] = iVar7;
      lVar20 = lVar20 + 1;
    } while (lVar20 == 1);
    local_58[0] = local_48;
    sVar10 = strlen((char *)&local_2c8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_58,&local_2c8,(long)&local_2c8 + sVar10);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
    std::ios_base::~ios_base(local_178);
    std::__cxx11::string::operator=(local_288,(string *)local_58);
    if (local_58[0] != local_48) {
      operator_delete(local_58[0]);
    }
    if (local_230 != local_220) {
      operator_delete(local_230);
    }
    this->mtu = 0x5dc;
    goto LAB_001077b4;
  }
  local_278 = local_268;
  pcVar2 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_278,pcVar2,pcVar2 + name->_M_string_length);
  local_290 = name;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
  lVar20 = 0;
  do {
    iVar7 = socket(0x11,3,0x300);
    iVar9 = (int)lVar20;
    if (iVar7 < 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1e8,"--- Unable to create the Tx/Rx socket channel.",0x2e);
      std::endl<char,std::char_traits<char>>((ostream *)local_1e8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"    Name: ",10);
      poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1e8,local_278,local_270);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16," Queue: ",8);
      poVar16 = (ostream *)std::ostream::operator<<(poVar16,iVar9);
      std::endl<char,std::char_traits<char>>(poVar16);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"    Error: ",0xb);
      piVar14 = __errno_location();
      pcVar15 = strerror(*piVar14);
      std::operator<<((ostream *)local_1e8,pcVar15);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8," (",2);
      poVar16 = (ostream *)std::ostream::operator<<((ostream *)local_1e8,*piVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,").",2);
      std::endl<char,std::char_traits<char>>(poVar16);
LAB_00107db8:
      if (iVar9 == 1) {
        iVar7 = close(local_298.rx);
        if (iVar7 < 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1e8,"--- Unable to close a Rx/Tx socket.",0x23);
          std::endl<char,std::char_traits<char>>((ostream *)local_1e8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"    Name: ",10);
          poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1e8,local_278,local_270);
          std::__ostream_insert<char,std::char_traits<char>>(poVar16," Queue: ",8);
          poVar16 = (ostream *)std::ostream::operator<<(poVar16,0);
          std::endl<char,std::char_traits<char>>(poVar16);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"    Error: ",0xb)
          ;
          piVar14 = __errno_location();
          pcVar15 = strerror(*piVar14);
          std::operator<<((ostream *)local_1e8,pcVar15);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8," (",2);
          poVar16 = (ostream *)std::ostream::operator<<((ostream *)local_1e8,*piVar14);
          std::__ostream_insert<char,std::char_traits<char>>(poVar16,").",2);
          std::endl<char,std::char_traits<char>>(poVar16);
        }
      }
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar17,(string *)&local_2c8);
      __cxa_throw(prVar17,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_2b8 = 0;
    lStack_2b0 = 0;
    local_2c8 = (ulong *)0x0;
    lStack_2c0 = 0;
    local_2a8 = 0;
    strncpy((char *)&local_2c8,local_278,0xf);
    iVar8 = ioctl(iVar7,0x8933,&local_2c8);
    if (iVar8 == 0) {
      local_258._M_string_length = 0;
      local_258.field_2._M_allocated_capacity._0_4_ = 0;
      local_258._M_dataplus._M_p._4_4_ = (undefined4)local_2b8;
      local_258._M_dataplus._M_p._0_4_ = 0x3000011;
      iVar8 = bind(iVar7,(sockaddr *)&local_258,0x14);
      if (iVar8 == 0) {
        (&local_298.rx)[lVar20] = iVar7;
        iVar7 = 0;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1e8,"--- Unable to bind the Tx/Rx socket channel to the \'",0x34
                  );
        poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1e8,local_278,local_270);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\' network interface.",0x14);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
        std::ostream::put((char)poVar16);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"    Queue: ",0xb);
        poVar16 = (ostream *)std::ostream::operator<<((ostream *)local_1e8,iVar9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,".",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
        std::ostream::put((char)poVar16);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"    Error: ",0xb);
        piVar14 = __errno_location();
        pcVar15 = strerror(*piVar14);
        if (pcVar15 == (char *)0x0) {
          std::ios::clear((int)&local_2d8 +
                          (int)*(undefined8 *)(local_1e8[0]._M_dataplus._M_p + -0x18) + 0xf0);
        }
        else {
          sVar10 = strlen(pcVar15);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,pcVar15,sVar10);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8," (",2);
        poVar16 = (ostream *)std::ostream::operator<<((ostream *)local_1e8,*piVar14);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,").",2);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
        std::ostream::put((char)poVar16);
        iVar7 = 5;
        std::ostream::flush();
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1e8,"--- Unable to get network index number.",0x27);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"    Name: ",10);
      poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1e8,local_278,local_270);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16," Queue: ",8);
      plVar11 = (long *)std::ostream::operator<<(poVar16,iVar9);
      std::ios::widen((char)*(undefined8 *)(*plVar11 + -0x18) + (char)plVar11);
      std::ostream::put((char)plVar11);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"    Error: ",0xb);
      piVar14 = __errno_location();
      pcVar15 = strerror(*piVar14);
      if (pcVar15 == (char *)0x0) {
        std::ios::clear((int)&local_2d8 +
                        (int)*(undefined8 *)(local_1e8[0]._M_dataplus._M_p + -0x18) + 0xf0);
      }
      else {
        sVar10 = strlen(pcVar15);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,pcVar15,sVar10);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8," (",2);
      poVar16 = (ostream *)std::ostream::operator<<((ostream *)local_1e8,*piVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,").",2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
      std::ostream::put((char)poVar16);
      iVar7 = 5;
      std::ostream::flush();
    }
    if (iVar7 != 0) {
      if (iVar7 == 5) goto LAB_00107db8;
      break;
    }
    lVar20 = lVar20 + 1;
  } while (lVar20 == 1);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
  std::ios_base::~ios_base(local_178);
  if (local_278 != local_268) {
    operator_delete(local_278);
  }
  psVar6 = local_290;
  std::__cxx11::string::_M_assign(local_288);
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  pcVar2 = (psVar6->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_210,pcVar2,pcVar2 + psVar6->_M_string_length);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
  std::operator+(&local_258,"/sys/class/net/",&local_210);
  plVar11 = (long *)std::__cxx11::string::append((char *)&local_258);
  puVar19 = (ulong *)(plVar11 + 2);
  if ((ulong *)*plVar11 == puVar19) {
    local_2b8 = *puVar19;
    lStack_2b0 = plVar11[3];
    local_2c8 = &local_2b8;
  }
  else {
    local_2b8 = *puVar19;
    local_2c8 = (ulong *)*plVar11;
  }
  lStack_2c0 = plVar11[1];
  *plVar11 = (long)puVar19;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  iVar7 = open((char *)local_2c8,0x800);
  if (local_2c8 != &local_2b8) {
    operator_delete(local_2c8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p);
  }
  if (iVar7 < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e8,"--- Unable to open MTU file for \'",0x21);
    poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1e8,local_210._M_dataplus._M_p,local_210._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\' network interface.",0x14);
    std::endl<char,std::char_traits<char>>(poVar16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"    Error: ",0xb);
    piVar14 = __errno_location();
    pcVar15 = strerror(*piVar14);
    std::operator<<((ostream *)local_1e8,pcVar15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8," (",2);
    poVar16 = (ostream *)std::ostream::operator<<((ostream *)local_1e8,*piVar14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,").",2);
LAB_001083ba:
    std::endl<char,std::char_traits<char>>(poVar16);
    close(iVar7);
    prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar17,(string *)&local_2c8);
    __cxa_throw(prVar17,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  sVar12 = read(iVar7,local_58,4);
  local_58[0]._0_5_ = (uint5)(uint)local_58[0];
  if ((int)sVar12 == -1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e8,"--- Unable to read MTU for \'",0x1c);
    poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1e8,local_210._M_dataplus._M_p,local_210._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\' network interface.",0x14);
    std::endl<char,std::char_traits<char>>(poVar16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"    Error: ",0xb);
    piVar14 = __errno_location();
    pcVar15 = strerror(*piVar14);
    std::operator<<((ostream *)local_1e8,pcVar15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8," (",2);
    poVar16 = (ostream *)std::ostream::operator<<((ostream *)local_1e8,*piVar14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,").",2);
    goto LAB_001083ba;
  }
  iVar9 = close(iVar7);
  if (iVar9 < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e8,"--- Unable to close MTU file for \'",0x22);
    poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1e8,local_210._M_dataplus._M_p,local_210._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\' network interface.",0x14);
    std::endl<char,std::char_traits<char>>(poVar16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"    Error: ",0xb);
    piVar14 = __errno_location();
    pcVar15 = strerror(*piVar14);
    std::operator<<((ostream *)local_1e8,pcVar15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8," (",2);
    poVar16 = (ostream *)std::ostream::operator<<((ostream *)local_1e8,*piVar14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,").",2);
    goto LAB_001083ba;
  }
  local_2c8 = &local_2b8;
  sVar10 = strlen((char *)local_58);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2c8,local_58,(long)local_58 + sVar10);
  puVar19 = local_2c8;
  piVar14 = __errno_location();
  local_290 = (string *)CONCAT44(local_290._4_4_,*piVar14);
  *piVar14 = 0;
  uVar13 = strtoul((char *)puVar19,(char **)&local_258,10);
  if ((ulong *)local_258._M_dataplus._M_p == puVar19) {
    uVar18 = std::__throw_invalid_argument("stoul");
    if (local_2c8 != puVar19) {
      operator_delete(local_2c8);
    }
    if ((char)&local_2d8 != '\0') {
      __cxa_free_exception(piVar14);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
    std::ios_base::~ios_base(local_178);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p);
    }
    paVar5 = local_2d0;
    paVar4 = local_2d8;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
    ::~_Rb_tree(&(this->stats_cache)._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&(this->stats_keys_cache)._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&(this->ipv6s)._M_t);
    pcVar2 = (this->broadcast)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != local_70) {
      operator_delete(pcVar2);
    }
    pcVar2 = (this->netmask)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != local_68) {
      operator_delete(pcVar2);
    }
    pcVar2 = (this->ipv4)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != local_60) {
      operator_delete(pcVar2);
    }
    pcVar2 = (this->mac)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != paVar4) {
      operator_delete(pcVar2);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*(undefined1 **)local_288 != paVar5) {
      operator_delete(*(undefined1 **)local_288);
    }
    puVar3 = (local_1f0->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (puVar3 != (pointer)0x0) {
      operator_delete(puVar3);
    }
    _Unwind_Resume(uVar18);
  }
  if (*piVar14 == 0) {
LAB_00107748:
    *piVar14 = (int)local_290;
  }
  else if (*piVar14 == 0x22) {
    std::__throw_out_of_range("stoul");
    goto LAB_00107748;
  }
  if (local_2c8 != &local_2b8) {
    operator_delete(local_2c8);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
  std::ios_base::~ios_base(local_178);
  this->mtu = (uint)uVar13;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(local_1f0,(ulong)this->mtu);
LAB_001077b4:
  this->queues = local_298;
  this->kernel_socket = -1;
  iVar7 = socket(2,1,0);
  this->kernel_socket = iVar7;
  if (iVar7 < 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e8,"--- Unable to create IPv4 socket channel to the NET kernel.",
               0x3b);
    std::endl<char,std::char_traits<char>>((ostream *)local_1e8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"    Error: ",0xb);
    piVar14 = __errno_location();
    pcVar15 = strerror(*piVar14);
    std::operator<<((ostream *)local_1e8,pcVar15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8," (",2);
    poVar16 = (ostream *)std::ostream::operator<<((ostream *)local_1e8,*piVar14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,").",2);
    std::endl<char,std::char_traits<char>>(poVar16);
    prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar17,(string *)&local_2c8);
    __cxa_throw(prVar17,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this->kernel_socket_ipv6 = -1;
  iVar7 = socket(10,1,0);
  this->kernel_socket_ipv6 = iVar7;
  if (iVar7 < 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1e8,"--- Unable to create IPv6 socket channel to the NET kernel.",
               0x3b);
    std::endl<char,std::char_traits<char>>((ostream *)local_1e8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"    Error: ",0xb);
    piVar14 = __errno_location();
    pcVar15 = strerror(*piVar14);
    std::operator<<((ostream *)local_1e8,pcVar15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8," (",2);
    poVar16 = (ostream *)std::ostream::operator<<((ostream *)local_1e8,*piVar14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,").",2);
    std::endl<char,std::char_traits<char>>(poVar16);
    prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar17,(string *)&local_2c8);
    __cxa_throw(prVar17,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((int)local_27c < 0) {
    local_27c = idseq;
  }
  this->id = local_27c;
  idseq = idseq + 1;
  return;
}

Assistant:

VIfaceImpl::VIfaceImpl(string name, bool tap, int id)
{
    // Check name length
    if (name.length() >= IFNAMSIZ) {
        throw invalid_argument("--- Virtual interface name too long.");
    }

    // Create queues
    struct viface_queues queues;
    memset(&queues, 0, sizeof(struct viface_queues));

    /* Checks if the path name can be accessed. If so,
     * it means that the network interface is already defined.
     */
    if (access(("/sys/class/net/" + name).c_str(), F_OK) == 0) {
        hook_viface(name, &queues);
        this->name = name;

        // Read MTU value and resize buffer
        this->mtu = read_mtu(name, sizeof(this->mtu));
        this->pktbuff.resize(this->mtu);
    } else {
        this->name = alloc_viface(name, tap, &queues);

        // Other defaults
        this->mtu = 1500;
    }

    this->queues = queues;

    // Create socket channels to the NET kernel for later ioctl
    this->kernel_socket = -1;
    this->kernel_socket = socket(AF_INET, SOCK_STREAM, 0);
    if (this->kernel_socket < 0) {
        ostringstream what;
        what << "--- Unable to create IPv4 socket channel to the NET kernel.";
        what << endl;
        what << "    Error: " << strerror(errno);
        what << " (" << errno << ")." << endl;
        throw runtime_error(what.str());
    }

    this->kernel_socket_ipv6 = -1;
    this->kernel_socket_ipv6 = socket(AF_INET6, SOCK_STREAM, 0);
    if (this->kernel_socket_ipv6 < 0) {
        ostringstream what;
        what << "--- Unable to create IPv6 socket channel to the NET kernel.";
        what << endl;
        what << "    Error: " << strerror(errno);
        what << " (" << errno << ")." << endl;
        throw runtime_error(what.str());
    }

    // Set id
    if (id < 0) {
        this->id = this->idseq;
    } else {
        this->id = id;
    }
    this->idseq++;
}